

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
ExchangeSectionFixups_RoundTripInternalCollection_Test::TestBody
          (ExchangeSectionFixups_RoundTripInternalCollection_Test *this)

{
  pointer *this_00;
  bool bVar1;
  iterator first;
  iterator last;
  string *src;
  Message *pMVar2;
  error_code *this_01;
  char *pcVar3;
  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
  *matcher;
  char *in_R9;
  AssertHelper local_2f8;
  Message local_2f0;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
  local_2e8;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>_>
  local_2d0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar;
  string local_2a0;
  AssertHelper local_280;
  string local_278;
  Message local_258;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_;
  callbacks local_230;
  undefined1 local_220 [8];
  parser<pstore::exchange::import_ns::callbacks> parser;
  internal_fixup_collection imported_ifixups;
  string_mapping imported_names;
  indent local_cc;
  undefined1 local_c8 [8];
  ostringstream os;
  unsigned_long local_70;
  uchar local_62;
  section_kind local_61;
  long local_60 [2];
  uchar local_4e;
  section_kind local_4d [13];
  long local_40 [2];
  uchar local_2a;
  section_kind local_29;
  undefined1 local_28 [8];
  internal_fixup_collection ifixups;
  ExchangeSectionFixups_RoundTripInternalCollection_Test *this_local;
  
  ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::vector
            ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_28);
  local_29 = text;
  local_2a = '\x11';
  local_40[1] = 0x13;
  local_40[0] = 0x17;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             local_28,&local_29,&local_2a,(unsigned_long *)(local_40 + 1),local_40);
  local_4d[0] = text;
  local_4e = '\x1d';
  local_60[1] = 0x1f;
  local_60[0] = 0x25;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             local_28,local_4d,&local_4e,(unsigned_long *)(local_60 + 1),local_60);
  local_61 = thread_data;
  local_62 = ')';
  local_70 = 0x2b;
  os.str_.field_2._8_8_ = 0x2f;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             local_28,&local_61,&local_62,&stack0xffffffffffffff90,
             (long *)(os.str_.field_2._M_local_buf + 8));
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_c8);
  local_cc.distance_ = 0;
  pstore::exchange::export_ns::indent::indent(&local_cc);
  first = std::
          begin<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
                    ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                      *)local_28);
  last = std::
         end<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
                   ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                     *)local_28);
  pstore::exchange::export_ns::
  emit_internal_fixups<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>
            ((ostream_base *)local_c8,local_cc,
             (__normal_iterator<pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>
              )first._M_current,
             (__normal_iterator<pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>
              )last._M_current);
  this_00 = &imported_ifixups.
             super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)this_00);
  std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::vector
            ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             &parser.coordinate_);
  pstore::gsl::not_null<pstore::database_*>::not_null
            ((not_null<pstore::database_*> *)&gtest_ar_.message_,
             &(this->super_ExchangeSectionFixups).db_);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,pstore::repo::internal_fixup>,pstore::exchange::import_ns::string_mapping*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>,pstore::exchange::import_ns::string_mapping*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>
            (&local_230,
             (not_null<pstore::database_*>)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(string_mapping *)this_00,
             (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             &parser.coordinate_);
  pstore::json::make_parser<pstore::exchange::import_ns::callbacks>
            ((parser<pstore::exchange::import_ns::callbacks> *)local_220,&local_230,none);
  pstore::exchange::import_ns::callbacks::~callbacks(&local_230);
  src = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_c8);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
            ((parser<pstore::exchange::import_ns::callbacks> *)local_220,src);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof
            ((parser<pstore::exchange::import_ns::callbacks> *)local_220);
  local_249 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)local_220);
  local_249 = !local_249;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pMVar2 = testing::Message::operator<<(&local_258,(char (*) [17])"JSON error was: ");
    this_01 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)local_220);
    std::error_code::message_abi_cxx11_(&local_278,this_01);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2a0,(internal *)local_248,(AssertionResult *)0x2ecd1e,"true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    testing::Message::~Message(&local_258);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::
    ContainerEq<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
              (&local_2e8,(testing *)local_28,rhs);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>>
              (&local_2d0,(internal *)&local_2e8,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>>
    ::operator()(local_2b8,(char *)&local_2d0,
                 (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                  *)"imported_ifixups");
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>_>
    ::~PredicateFormatterFromMatcher(&local_2d0);
    testing::
    PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
    ::~PolymorphicMatcher(&local_2e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pMVar2 = testing::Message::operator<<
                         (&local_2f0,(char (*) [47])"The imported and exported ifixups should match"
                         );
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x77,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2f8,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message(&local_2f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_220);
  std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::~vector
            ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             &parser.coordinate_);
  pstore::exchange::import_ns::string_mapping::~string_mapping
            ((string_mapping *)
             &imported_ifixups.
              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_c8);
  std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::~vector
            ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_28);
  return;
}

Assistant:

TEST_F (ExchangeSectionFixups, RoundTripInternalCollection) {
    // Start with a small collection of internal fixups.
    internal_fixup_collection ifixups;
    ifixups.emplace_back (pstore::repo::section_kind::text, pstore::repo::relocation_type{17},
                          std::uint64_t{19} /*offset */, std::int64_t{23} /*addend*/);
    ifixups.emplace_back (pstore::repo::section_kind::text, pstore::repo::relocation_type{29},
                          std::uint64_t{31} /*offset */, std::int64_t{37} /*addend*/);
    ifixups.emplace_back (pstore::repo::section_kind::thread_data,
                          pstore::repo::relocation_type{41}, std::uint64_t{43} /*offset */,
                          std::int64_t{47} /*addend*/);

    // Export the internal fixup array to the 'os' string-stream.
    pstore::exchange::export_ns::ostringstream os;
    emit_internal_fixups (os, pstore::exchange::export_ns::indent{}, std::begin (ifixups),
                          std::end (ifixups));

    // Setup the parse.
    pstore::exchange::import_ns::string_mapping imported_names;
    internal_fixup_collection imported_ifixups;
    auto parser = pstore::json::make_parser (
        pstore::exchange::import_ns::callbacks::make<internal_fixup_array_root> (
            &db_, &imported_names, &imported_ifixups));

    // Import the data that we just exported.
    parser.input (os.str ());
    parser.eof ();

    // Check that we got back what we started with.
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();
    EXPECT_THAT (imported_ifixups, testing::ContainerEq (ifixups))
        << "The imported and exported ifixups should match";
}